

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleTypeHandler<1UL>::GetPropertyEquivalenceInfo
          (SimpleTypeHandler<1UL> *this,PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info
          )

{
  PropertyIndex PVar1;
  PropertyId propertyId;
  BOOL BVar2;
  ushort local_2a;
  PropertyEquivalenceInfo *pPStack_28;
  PropertyIndex index;
  PropertyEquivalenceInfo *info_local;
  PropertyRecord *propertyRecord_local;
  SimpleTypeHandler<1UL> *this_local;
  
  pPStack_28 = info;
  info_local = (PropertyEquivalenceInfo *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  propertyId = PropertyRecord::GetPropertyId(propertyRecord);
  BVar2 = GetDescriptor(this,propertyId,&local_2a);
  if ((BVar2 == 0) || ((this->descriptors[local_2a].field_1.Attributes & 8) != 0)) {
    pPStack_28->slotIndex = 0xffff;
    pPStack_28->isWritable = true;
    this_local._7_1_ = false;
  }
  else {
    PVar1 = DynamicTypeHandler::AdjustSlotIndexForInlineSlots
                      (&this->super_DynamicTypeHandler,local_2a);
    pPStack_28->slotIndex = PVar1;
    pPStack_28->isWritable = (this->descriptors[local_2a].field_1.Attributes & 4) != 0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleTypeHandler<size>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            info.slotIndex = AdjustSlotIndexForInlineSlots((PropertyIndex)index);
            info.isWritable = !!(descriptors[index].Attributes & PropertyWritable);
            return true;
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isWritable = true;
            return false;
        }
    }